

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void countFinalize(sqlite3_context *context)

{
  Mem *p;
  anon_union_8_5_44880d43_for_u aVar1;
  
  p = context->pMem;
  if ((p->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(p);
    p->flags = 1;
    p->z = (char *)0x0;
  }
  if ((anon_union_8_5_44880d43_for_u *)p->z == (anon_union_8_5_44880d43_for_u *)0x0) {
    aVar1.i = 0;
  }
  else {
    aVar1 = *(anon_union_8_5_44880d43_for_u *)p->z;
  }
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u = aVar1;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void countFinalize(sqlite3_context *context){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  sqlite3_result_int64(context, p ? p->n : 0);
}